

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::EmptyCharsetBitstateAssumptions(void)

{
  bool bVar1;
  ostream *poVar2;
  StringPiece *local_2f8;
  LogMessage local_2f0;
  StringPiece local_160;
  RE2 local_150;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  StringPiece group [6];
  
  local_2f8 = (StringPiece *)local_68;
  do {
    StringPiece::StringPiece(local_2f8);
    local_2f8 = local_2f8 + 1;
  } while (local_2f8 != (StringPiece *)&group[5].length_);
  for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
    RE2::RE2(&local_150,EmptyCharsetBitstateAssumptions::nop_empties[local_6c]);
    StringPiece::StringPiece(&local_160,"");
    bVar1 = RE2::Match(&local_150,&local_160,0,0,UNANCHORED,(StringPiece *)local_68,6);
    RE2::~RE2(&local_150);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x20c);
      poVar2 = LogMessage::stream(&local_2f0);
      std::operator<<(poVar2,
                      "Check failed: RE2(nop_empties[i]).Match(\"\", 0, 0, RE2::UNANCHORED, group, 6)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2f0);
    }
  }
  return;
}

Assistant:

TEST(EmptyCharset, BitstateAssumptions) {
  // Captures trigger use of Bitstate.
  static const char *nop_empties[] = {
    "((((()))))" "[^\\S\\s]?",
    "((((()))))" "([^\\S\\s])?",
    "((((()))))" "([^\\S\\s]|[^\\S\\s])?",
    "((((()))))" "(([^\\S\\s]|[^\\S\\s])|)"
  };
  StringPiece group[6];
  for (int i = 0; i < arraysize(nop_empties); i++)
    CHECK(RE2(nop_empties[i]).Match("", 0, 0, RE2::UNANCHORED, group, 6));
}